

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O3

void soplex::LPFwriteRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *p_lp,ostream *p_output,NameSet *p_cnames,
                        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *p_svec,Rational *p_lhs,Rational *p_rhs,SPxOut *spxout)

{
  _Alloc_hider _Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  *this;
  char *pcVar5;
  long in_FS_OFFSET;
  double result;
  string local_58;
  pointer local_38;
  
  lVar3 = std::ostream::tellp();
  LPFwriteSVector(p_lp,p_output,p_cnames,p_svec,spxout,false);
  iVar2 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&p_lhs->m_backend,&p_rhs->m_backend);
  this = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
          *)p_rhs;
  if (iVar2 != 0) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    boost::multiprecision::detail::
    generic_convert_rational_to_float<double,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
              ((double *)&local_58,&p_lhs->m_backend);
    local_38 = local_58._M_dataplus._M_p;
    ::soplex::infinity::__tls_init();
    if (-*(double *)(in_FS_OFFSET + -8) < (double)local_38) {
      this = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
              *)p_lhs;
    }
  }
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::str_abi_cxx11_(&local_58,this,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  lVar4 = std::ostream::tellp();
  if (0xff9c < (long)((local_58._M_string_length - lVar3) + lVar4)) {
    std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
    lVar4 = std::ostream::tellp();
    if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar4 - lVar3)) && (0 < (int)spxout->m_verbosity))
    {
      local_58._M_dataplus._M_p._0_4_ = spxout->m_verbosity;
      (*spxout->_vptr_SPxOut[2])(spxout);
      std::__ostream_insert<char,std::char_traits<char>>
                (spxout->m_streams[spxout->m_verbosity],
                 "XLPSWR02 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
                 ,0x53);
      (*spxout->_vptr_SPxOut[2])(spxout,&local_58);
    }
    lVar3 = std::ostream::tellp();
  }
  iVar2 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&p_lhs->m_backend,&p_rhs->m_backend);
  if (iVar2 == 0) {
    pcVar5 = " = ";
    lVar4 = 3;
  }
  else {
    local_58._M_dataplus._M_p = (pointer)0x0;
    boost::multiprecision::detail::
    generic_convert_rational_to_float<double,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
              ((double *)&local_58,&p_lhs->m_backend);
    _Var1._M_p = local_58._M_dataplus._M_p;
    ::soplex::infinity::__tls_init();
    if (-*(double *)(in_FS_OFFSET + -8) < (double)_Var1._M_p) {
      std::__ostream_insert<char,std::char_traits<char>>(p_output," >= ",4);
      goto LAB_0012c26c;
    }
    pcVar5 = " <= ";
    lVar4 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar5,lVar4);
  p_lhs = p_rhs;
LAB_0012c26c:
  boost::multiprecision::operator<<(p_output,p_lhs);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  lVar4 = std::ostream::tellp();
  if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar4 - lVar3)) && (0 < (int)spxout->m_verbosity)) {
    local_58._M_dataplus._M_p._0_4_ = spxout->m_verbosity;
    (*spxout->_vptr_SPxOut[2])(spxout);
    std::__ostream_insert<char,std::char_traits<char>>
              (spxout->m_streams[spxout->m_verbosity],
               "XLPSWR03 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
               ,0x53);
    (*spxout->_vptr_SPxOut[2])(spxout,&local_58);
  }
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<Rational>&   p_lp,       ///< the LP
   std::ostream&            p_output,   ///< output stream
   const NameSet*           p_cnames,   ///< column names
   const SVectorBase<Rational>& p_svec,     ///< vector of the row
   const Rational&              p_lhs,      ///< lhs of the row
   const Rational&              p_rhs,      ///< rhs of the row
   SPxOut*                      spxout      ///< out stream
)
{

   long long pos;
   pos = p_output.tellp();

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec, spxout);

   long long sidelen;
   sidelen = (p_lhs == p_rhs
              || double(p_lhs) <= double(-infinity)) ? (long long)p_rhs.str().length()
             : (long long)p_lhs.str().length();

   // insert a line break if max line length is in danger of being exceeded
   if((long long)(p_output.tellp()) - pos + sidelen + (long long)100 > SOPLEX_MAX_LINE_WRITE_LEN)
   {
      p_output << "\n\t";

      if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) <<
                         "XLPSWR02 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
      }

      pos = p_output.tellp();
   }

   // write bound value
   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(double(p_lhs) <= double(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(double(p_rhs) >= double(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";

   if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XLPSWR03 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
   }
}